

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_block(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *this,size_t node,size_t ilevel,size_t do_indent)

{
  size_t *psVar1;
  Tree *pTVar2;
  ulong uVar3;
  NodeType_e NVar4;
  size_t sVar5;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  code *pcVar7;
  long lVar8;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  Location loc_22;
  Location loc_23;
  long lVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  error_flags eVar14;
  ulong uVar15;
  NodeScalar *pNVar16;
  csubstr *pcVar17;
  NodeData *pNVar18;
  char *pcVar19;
  
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar14 = get_error_flags();
    if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  if ((~(int)pTVar2->m_buf[node].m_type.type & 0x28U) == 0) {
    eVar14 = get_error_flags();
    if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x597d) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x597d) << 0x40,8);
    loc_00.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_00.name.len = 0x65;
    error("check failed: !m_tree->is_stream(node)",0x26,loc_00);
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar14 = get_error_flags();
    if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    loc_01.super_LineCol.col = 0;
    loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_01.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_01.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
  }
  if ((pTVar2->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) {
    pTVar2 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      eVar14 = get_error_flags();
      if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      loc_02.super_LineCol.col = 0;
      loc_02.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_02.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_02.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_02.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_02);
    }
    if ((pTVar2->m_buf[node].m_type.type & DOC) == NOTYPE) {
      eVar14 = get_error_flags();
      if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      loc_03.super_LineCol.col = 0;
      loc_03.super_LineCol.offset = SUB168(ZEXT816(0x597e) << 0x40,0);
      loc_03.super_LineCol.line = SUB168(ZEXT816(0x597e) << 0x40,8);
      loc_03.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_03.name.len = 0x65;
      error("check failed: m_tree->is_container(node) || m_tree->is_doc(node)",0x40,loc_03);
    }
  }
  bVar10 = Tree::is_root(this->m_tree,node);
  if (!bVar10) {
    pTVar2 = this->m_tree;
    bVar10 = Tree::has_parent(pTVar2,node);
    if (!bVar10) {
      eVar14 = get_error_flags();
      if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      loc_04.super_LineCol.col = 0;
      loc_04.super_LineCol.offset = SUB168(ZEXT816(0x4beb) << 0x40,0);
      loc_04.super_LineCol.line = SUB168(ZEXT816(0x4beb) << 0x40,8);
      loc_04.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_04.name.len = 0x65;
      error("check failed: has_parent(node)",0x1e,loc_04);
    }
    uVar15 = pTVar2->m_cap;
    if (node == 0xffffffffffffffff || uVar15 <= node) {
      eVar14 = get_error_flags();
      if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      loc_05.super_LineCol.col = 0;
      loc_05.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_05.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_05.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_05.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_05);
      uVar15 = pTVar2->m_cap;
    }
    pNVar18 = pTVar2->m_buf;
    uVar3 = pNVar18[node].m_parent;
    if ((uVar3 == 0xffffffffffffffff) || (uVar15 <= uVar3)) {
      eVar14 = get_error_flags();
      if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      loc_06.super_LineCol.col = 0;
      loc_06.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_06.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_06.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_06.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_06);
      pNVar18 = pTVar2->m_buf;
    }
    if ((pNVar18[uVar3].m_type.type & MAP) == NOTYPE) {
      pTVar2 = this->m_tree;
      bVar10 = Tree::has_parent(pTVar2,node);
      if (!bVar10) {
        eVar14 = get_error_flags();
        if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar7 = (code *)swi(3);
          (*pcVar7)();
          return;
        }
        loc_07.super_LineCol.col = 0;
        loc_07.super_LineCol.offset = SUB168(ZEXT816(0x4bea) << 0x40,0);
        loc_07.super_LineCol.line = SUB168(ZEXT816(0x4bea) << 0x40,8);
        loc_07.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_07.name.len = 0x65;
        error("check failed: has_parent(node)",0x1e,loc_07);
      }
      uVar15 = pTVar2->m_cap;
      if (node == 0xffffffffffffffff || uVar15 <= node) {
        eVar14 = get_error_flags();
        if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar7 = (code *)swi(3);
          (*pcVar7)();
          return;
        }
        loc_08.super_LineCol.col = 0;
        loc_08.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
        loc_08.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
        loc_08.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_08.name.len = 0x65;
        error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_08);
        uVar15 = pTVar2->m_cap;
      }
      pNVar18 = pTVar2->m_buf;
      uVar3 = pNVar18[node].m_parent;
      if ((uVar3 == 0xffffffffffffffff) || (uVar15 <= uVar3)) {
        eVar14 = get_error_flags();
        if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar7 = (code *)swi(3);
          (*pcVar7)();
          return;
        }
        loc_09.super_LineCol.col = 0;
        loc_09.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
        loc_09.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
        loc_09.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_09.name.len = 0x65;
        error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_09);
        pNVar18 = pTVar2->m_buf;
      }
      if ((pNVar18[uVar3].m_type.type & SEQ) == NOTYPE) {
        eVar14 = get_error_flags();
        if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar7 = (code *)swi(3);
          (*pcVar7)();
          return;
        }
        loc_10.super_LineCol.col = 0;
        loc_10.super_LineCol.offset = SUB168(ZEXT816(0x597f) << 0x40,0);
        loc_10.super_LineCol.line = SUB168(ZEXT816(0x597f) << 0x40,8);
        loc_10.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_10.name.len = 0x65;
        error("check failed: m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node))"
              ,99,loc_10);
      }
    }
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar14 = get_error_flags();
    if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    loc_11.super_LineCol.col = 0;
    loc_11.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_11.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_11.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_11.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_11);
  }
  if ((pTVar2->m_buf[node].m_type.type & DOC) != NOTYPE) {
    _write_doc(this,node);
    bVar10 = Tree::has_children(this->m_tree,node);
    if (!bVar10) {
      return;
    }
    goto LAB_001b1da0;
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar14 = get_error_flags();
    if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    loc_12.super_LineCol.col = 0;
    loc_12.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_12.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_12.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_12.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_12);
  }
  if ((pTVar2->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) goto LAB_001b1da0;
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar14 = get_error_flags();
    if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    loc_13.super_LineCol.col = 0;
    loc_13.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_13.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_13.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_13.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_13);
  }
  if ((pTVar2->m_buf[node].m_type.type & MAP) == NOTYPE) {
    pTVar2 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      eVar14 = get_error_flags();
      if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      loc_14.super_LineCol.col = 0;
      loc_14.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_14.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_14.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_14.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_14);
    }
    if ((pTVar2->m_buf[node].m_type.type & SEQ) == NOTYPE) {
      eVar14 = get_error_flags();
      if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      loc_15.super_LineCol.col = 0;
      loc_15.super_LineCol.offset = SUB168(ZEXT816(0x598a) << 0x40,0);
      loc_15.super_LineCol.line = SUB168(ZEXT816(0x598a) << 0x40,8);
      loc_15.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_15.name.len = 0x65;
      error("check failed: m_tree->is_map(node) || m_tree->is_seq(node)",0x3a,loc_15);
    }
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar14 = get_error_flags();
    if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    loc_16.super_LineCol.col = 0;
    loc_16.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_16.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_16.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_16.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_16);
  }
  lVar8 = do_indent * ilevel * 2;
  lVar9 = lVar8;
  if ((pTVar2->m_buf[node].m_type.type & KEY) == NOTYPE) {
    bVar10 = Tree::is_root(this->m_tree,node);
    if (!bVar10) {
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream + '\x10');
      }
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + lVar8;
      goto LAB_001b1952;
    }
    bVar10 = false;
  }
  else {
    for (; lVar9 != 0; lVar9 = lVar9 + -1) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
    }
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + lVar8;
    pNVar16 = Tree::keysc(this->m_tree,node);
    pTVar2 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      eVar14 = get_error_flags();
      if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      loc_17.super_LineCol.col = 0;
      loc_17.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_17.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_17.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_17.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_17);
    }
    _write(this,(int)pNVar16,(void *)(ulong)((uint)pTVar2->m_buf[node].m_type.type & 0x2aa2142),
           ilevel);
LAB_001b1952:
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
    bVar10 = true;
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar14 = get_error_flags();
    if (((eVar14 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    loc_18.super_LineCol.col = 0;
    loc_18.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_18.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_18.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_18.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_18);
  }
  NVar4 = pTVar2->m_buf[node].m_type.type;
  if ((NVar4 & (SEQ|MAP|VAL)) == NOTYPE || ((uint)NVar4 >> 0xb & 1) == 0) {
    bVar11 = false;
  }
  else {
    if (bVar10) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
    }
    pcVar17 = Tree::val_tag(this->m_tree,node);
    _write_tag(this,*pcVar17);
    bVar11 = true;
    bVar10 = true;
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar14 = get_error_flags();
    if (((eVar14 & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    loc_19.super_LineCol.col = 0;
    loc_19.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_19.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_19.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_19.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_19);
  }
  NVar4 = pTVar2->m_buf[node].m_type.type;
  if ((NVar4 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar4 >> 9 & 1) != 0) {
    if (bVar10) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
    pcVar17 = Tree::val_anchor(this->m_tree,node);
    sVar5 = pcVar17->len;
    if (pcVar17->str != (char *)0x0 && sVar5 != 0) {
      std::ostream::write((char *)((this->
                                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).m_stream + 0x10),(long)pcVar17->str);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + sVar5;
    }
    bVar11 = true;
    bVar10 = true;
  }
  bVar13 = Tree::has_children(this->m_tree,node);
  pTVar2 = this->m_tree;
  bVar12 = pTVar2->m_cap <= node;
  if (!bVar13) {
    if (bVar12 || node == 0xffffffffffffffff) {
      eVar14 = get_error_flags();
      if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      loc_21.super_LineCol.col = 0;
      loc_21.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_21.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_21.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_21.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_21);
    }
    if ((pTVar2->m_buf[node].m_type.type & SEQ) == NOTYPE) {
      pTVar2 = this->m_tree;
      if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
        eVar14 = get_error_flags();
        if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar7 = (code *)swi(3);
          (*pcVar7)();
          return;
        }
        loc_22.super_LineCol.col = 0;
        loc_22.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
        loc_22.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
        loc_22.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_22.name.len = 0x65;
        error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_22);
      }
      if ((pTVar2->m_buf[node].m_type.type & MAP) == NOTYPE) {
        return;
      }
      pbVar6 = (this->
               super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).m_stream;
      pcVar19 = " {}\n";
    }
    else {
      pbVar6 = (this->
               super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).m_stream;
      pcVar19 = " []\n";
    }
    std::ostream::write((char *)(pbVar6 + 0x10),(long)pcVar19);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 4;
    return;
  }
  if (bVar12 || node == 0xffffffffffffffff) {
    eVar14 = get_error_flags();
    if (((eVar14 & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    loc_20.super_LineCol.col = 0;
    loc_20.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_20.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_20.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_20.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_20);
  }
  bVar12 = bVar10;
  if ((pTVar2->m_buf[node].m_type.type & KEY) == NOTYPE) {
    bVar13 = Tree::is_root(this->m_tree,node);
    if ((!bVar13) && (bVar12 = true, bVar11)) {
      bVar12 = bVar10;
    }
  }
  else {
    bVar11 = true;
  }
  if (bVar12) {
    if (bVar11) goto LAB_001b1d80;
    do_indent = 0;
  }
  else {
    if (!bVar11) {
      do_indent = 0;
      goto LAB_001b1da0;
    }
LAB_001b1d80:
    do_indent = 1;
  }
  std::ostream::put((char)(this->
                          super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).m_stream + '\x10');
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + 1;
LAB_001b1da0:
  bVar10 = Tree::is_root(this->m_tree,node);
  if (!bVar10) {
    pTVar2 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      eVar14 = get_error_flags();
      if (((eVar14 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      loc_23.super_LineCol.col = 0;
      loc_23.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_23.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_23.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_23.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_23);
    }
    if ((pTVar2->m_buf[node].m_type.type & DOC) == NOTYPE) {
      ilevel = ilevel + 1;
    }
  }
  _do_visit_block_container(this,node,ilevel,do_indent);
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_block(size_t node, size_t ilevel, size_t do_indent)
{
    RYML_ASSERT(!m_tree->is_stream(node));
    RYML_ASSERT(m_tree->is_container(node) || m_tree->is_doc(node));
    RYML_ASSERT(m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node)));
    RepC ind = indent_to(do_indent * ilevel);

    if(m_tree->is_doc(node))
    {
        _write_doc(node);
        if(!m_tree->has_children(node))
            return;
    }
    else if(m_tree->is_container(node))
    {
        RYML_ASSERT(m_tree->is_map(node) || m_tree->is_seq(node));

        bool spc = false; // write a space
        bool nl = false;  // write a newline

        if(m_tree->has_key(node))
        {
            this->Writer::_do_write(ind);
            _writek(node, ilevel);
            this->Writer::_do_write(':');
            spc = true;
        }
        else if(!m_tree->is_root(node))
        {
            this->Writer::_do_write(ind);
            this->Writer::_do_write('-');
            spc = true;
        }

        if(m_tree->has_val_tag(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(node));
            spc = true;
            nl = true;
        }

        if(m_tree->has_val_anchor(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(node));
            spc = true;
            nl = true;
        }

        if(m_tree->has_children(node))
        {
            if(m_tree->has_key(node))
                nl = true;
            else
                if(!m_tree->is_root(node) && !nl)
                    spc = true;
        }
        else
        {
            if(m_tree->is_seq(node))
                this->Writer::_do_write(" []\n");
            else if(m_tree->is_map(node))
                this->Writer::_do_write(" {}\n");
            return;
        }

        if(spc && !nl)
            this->Writer::_do_write(' ');

        do_indent = 0;
        if(nl)
        {
            this->Writer::_do_write('\n');
            do_indent = 1;
        }
    } // container

    size_t next_level = ilevel + 1;
    if(m_tree->is_root(node) || m_tree->is_doc(node))
        next_level = ilevel; // do not indent at top level

    _do_visit_block_container(node, next_level, do_indent);
}